

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::~session_impl(session_impl *this)

{
  _Atomic_word *p_Var1;
  torrent_map *this_00;
  torrent_map *this_01;
  long *plVar2;
  pointer psVar3;
  pointer pbVar4;
  _Manager_type p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  dht_storage_interface *pdVar7;
  pointer ppVar8;
  ip_change_notifier *piVar9;
  pointer pptVar10;
  disk_interface *pdVar11;
  pointer pbVar12;
  pointer psVar13;
  void *pvVar14;
  long *plVar15;
  int iVar16;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar17;
  long lVar18;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  LOCK();
  (this->m_alerts).m_alert_mask._M_i.m_val = 0;
  UNLOCK();
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  alert_manager::set_notify_function(&this->m_alerts,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  ::std::
  _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,_std::shared_ptr<libtorrent::aux::peer_connection>,_std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::clear(&(this->m_connections)._M_t);
  psVar3 = (this->m_torrents).m_array.
           super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar17 = (this->m_torrents).m_array.
                 super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar3; psVar17 = psVar17 + 1
      ) {
    torrent::panic((psVar17->
                   super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    torrent::abort((psVar17->
                   super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
  }
  ::std::
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ::clear(&(this->m_torrents).m_array);
  this_00 = &(this->m_torrents).m_index;
  ::std::
  _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  this_01 = &(this->m_torrents).m_obfuscated_index;
  ::std::
  _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_01->_M_h);
  abort_stage2(this);
  lVar18 = 0;
  do {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::~vector((vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
               *)((long)&(this->m_ses_extensions)._M_elems[4].
                         super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x78);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_close_file_timer).impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_lsd_announce_timer).impl_);
  ::std::
  deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ::~deque(&this->m_prio_torrents);
  ::std::
  deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ::~deque(&this->m_dht_torrents);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_timer).impl_);
  aux::utp_socket_manager::~utp_socket_manager(&this->m_ssl_utp_socket_manager);
  aux::utp_socket_manager::~utp_socket_manager(&this->m_utp_socket_manager);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_dht_announce_timer).impl_);
  pbVar4 = (this->m_dht_nodes).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->m_dht_nodes).
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  pbVar4 = (this->m_dht_router_nodes).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->m_dht_router_nodes).
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  p_Var5 = (this->m_dht_storage_constructor).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->m_dht_storage_constructor,
              (_Any_data *)&this->m_dht_storage_constructor,__destroy_functor);
  }
  p_Var6 = (this->m_dht).
           super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  pdVar7 = (this->m_dht_storage)._M_t.
           super___uniq_ptr_impl<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::dht::dht_storage_interface_*,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
           .super__Head_base<0UL,_libtorrent::dht::dht_storage_interface_*,_false>._M_head_impl;
  if (pdVar7 != (dht_storage_interface *)0x0) {
    (*pdVar7->_vptr_dht_storage_interface[0xc])();
  }
  (this->m_dht_storage)._M_t.
  super___uniq_ptr_impl<libtorrent::dht::dht_storage_interface,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::dht::dht_storage_interface_*,_std::default_delete<libtorrent::dht::dht_storage_interface>_>
  .super__Head_base<0UL,_libtorrent::dht::dht_storage_interface_*,_false>._M_head_impl =
       (dht_storage_interface *)0x0;
  pbVar4 = (this->m_dht_state).nodes6.
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->m_dht_state).nodes6.
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  pbVar4 = (this->m_dht_state).nodes.
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (pointer)0x0) {
    operator_delete(pbVar4,(long)(this->m_dht_state).nodes.
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar4);
  }
  ppVar8 = (this->m_dht_state).nids.
           super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar8 != (pointer)0x0) {
    operator_delete(ppVar8,(long)(this->m_dht_state).nids.
                                 super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar8);
  }
  if ((this->m_i2p_listen_socket).
      super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
      .
      super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
      ._M_engaged == true) {
    (this->m_i2p_listen_socket).
    super__Optional_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>,_true,_false,_false>
    .
    super__Optional_payload_base<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
    ._M_engaged = false;
    ::std::__detail::__variant::
    _Variant_storage<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
    ::~_Variant_storage((_Variant_storage<false,_libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                         *)&this->m_i2p_listen_socket);
  }
  i2p_connection::~i2p_connection(&this->m_i2p_conn);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ::~vector(&this->m_listen_sockets);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_outgoing_interfaces);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::~vector(&this->m_listen_interfaces);
  piVar9 = (this->m_ip_notifier)._M_t.
           super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
           .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl;
  if (piVar9 != (ip_change_notifier *)0x0) {
    (*piVar9->_vptr_ip_change_notifier[3])();
  }
  (this->m_ip_notifier)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
  .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl =
       (ip_change_notifier *)0x0;
  port_filter::~port_filter(&this->m_port_filter);
  p_Var6 = (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  ip_filter::~ip_filter(&this->m_peer_class_filter);
  ::std::_Rb_tree<$9529104f$>::~_Rb_tree(&(this->m_incoming_sockets)._M_t);
  ::std::
  _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,_std::shared_ptr<libtorrent::aux::peer_connection>,_std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::~_Rb_tree(&(this->m_connections)._M_t);
  boost::asio::
  executor_work_guard<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>,_void>
  ::~executor_work_guard(&this->m_work);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::~vector(&this->m_undead_peers);
  pptVar10 = (this->m_download_queue).
             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
             super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (pptVar10 != (pointer)0x0) {
    operator_delete(pptVar10,(long)(this->m_download_queue).
                                   super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   .
                                   super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)pptVar10);
  }
  ::std::
  _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_01->_M_h);
  ::std::
  _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
  ::~vector(&(this->m_torrents).m_array);
  tracker_manager::~tracker_manager(&this->m_tracker_manager);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  ::~_Rb_tree(&(this->m_host_resolver).m_callbacks._M_t);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_host_resolver).m_critical_resolver.impl_);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&(this->m_host_resolver).m_resolver.impl_);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_host_resolver).m_failed_cache._M_h);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_host_resolver).m_cache._M_h);
  ::std::vector<libtorrent::aux::bw_request,_std::allocator<libtorrent::aux::bw_request>_>::~vector
            (&(this->m_upload_rate).m_queue);
  ::std::vector<libtorrent::aux::bw_request,_std::allocator<libtorrent::aux::bw_request>_>::~vector
            (&(this->m_download_rate).m_queue);
  pdVar11 = (this->m_disk_thread)._M_t.
            super___uniq_ptr_impl<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::disk_interface_*,_std::default_delete<libtorrent::disk_interface>_>
            .super__Head_base<0UL,_libtorrent::disk_interface_*,_false>._M_head_impl;
  if (pdVar11 != (disk_interface *)0x0) {
    (*pdVar11->_vptr_disk_interface[0x14])();
  }
  (this->m_disk_thread)._M_t.
  super___uniq_ptr_impl<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::disk_interface_*,_std::default_delete<libtorrent::disk_interface>_>
  .super__Head_base<0UL,_libtorrent::disk_interface_*,_false>._M_head_impl = (disk_interface *)0x0;
  alert_manager::~alert_manager(&this->m_alerts);
  boost::asio::ssl::context::~context(&this->m_peer_ssl_ctx);
  boost::asio::ssl::context::~context(&this->m_ssl_ctx);
  pbVar12 = (this->m_block_info_storage).
            super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pbVar12 != (pointer)0x0) {
    operator_delete(pbVar12,(long)(this->m_block_info_storage).
                                  super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar12
                   );
  }
  boost::pool<libtorrent::aux::allocator_new_delete>::purge_memory
            (&(this->m_peer_allocator).m_i2p_peer_pool);
  boost::pool<libtorrent::aux::allocator_new_delete>::purge_memory
            (&(this->m_peer_allocator).m_ipv6_peer_pool);
  boost::pool<libtorrent::aux::allocator_new_delete>::purge_memory
            (&(this->m_peer_allocator).m_ipv4_peer_pool);
  psVar13 = (this->m_classes).m_free_list.
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar13 != (pointer)0x0) {
    operator_delete(psVar13,(long)(this->m_classes).m_free_list.
                                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar13
                   );
  }
  ::std::deque<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_>::~deque
            ((deque<libtorrent::peer_class,_std::allocator<libtorrent::peer_class>_> *)
             &this->m_classes);
  lVar18 = 0;
  do {
    pvVar14 = *(void **)((long)((this->m_stats_counters).m_stats_counter.
                                super_array<std::atomic<long>,_291UL>._M_elems + -0x10) + lVar18);
    if (pvVar14 != (void *)0x0) {
      operator_delete(pvVar14,*(long *)((long)((this->m_stats_counters).m_stats_counter.
                                               super_array<std::atomic<long>,_291UL>._M_elems + -0xe
                                              ) + lVar18) - (long)pvVar14);
    }
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0xc0);
  lVar18 = 0x228;
  do {
    plVar2 = (long *)((long)&(this->super_session_interface).super_session_logger.
                             _vptr_session_logger + lVar18);
    plVar15 = *(long **)((long)this + lVar18 + -0x10);
    if (plVar2 != plVar15) {
      operator_delete(plVar15,*plVar2 + 1);
    }
    lVar18 = lVar18 + -0x20;
  } while (lVar18 != 0x88);
  ::std::condition_variable::~condition_variable(&this->cond);
  p_Var6 = (this->super_enable_shared_from_this<libtorrent::aux::session_impl>)._M_weak_this.
           super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar16 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar16 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar16 + -1;
    }
    if (iVar16 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

session_impl::~session_impl()
	{
		// since we're destructing the session, no more alerts will make it out to
		// the user. So stop posting them now
		m_alerts.set_alert_mask({});
		m_alerts.set_notify_function({});

		// this is not allowed to be the network thread!
//		TORRENT_ASSERT(is_not_thread());
// TODO: asserts that no outstanding async operations are still in flight

		// this can happen if we end the io_context run loop with an exception
		m_connections.clear();
		for (auto& t : m_torrents)
		{
			t->panic();
			t->abort();
		}
		m_torrents.clear();

		// this has probably been called already, but in case of sudden
		// termination through an exception, it may not have been done
		abort_stage2();

#if defined TORRENT_ASIO_DEBUGGING
		FILE* f = fopen("wakeups.log", "w+");
		if (f != nullptr)
		{
			time_point m = min_time();
			if (!_wakeups.empty()) m = _wakeups[0].timestamp;
			time_point prev = m;
			std::uint64_t prev_csw = 0;
			if (!_wakeups.empty()) prev_csw = _wakeups[0].context_switches;
			std::fprintf(f, "abs. time\trel. time\tctx switch\tidle-wakeup\toperation\n");
			for (wakeup_t const& w : _wakeups)
			{
				bool const idle_wakeup = w.context_switches > prev_csw;
				std::fprintf(f, "%" PRId64 "\t%" PRId64 "\t%" PRId64 "\t%c\t%s\n"
					, total_microseconds(w.timestamp - m)
					, total_microseconds(w.timestamp - prev)
					, w.context_switches
					, idle_wakeup ? '*' : '.'
					, w.operation);
				prev = w.timestamp;
				prev_csw = w.context_switches;
			}
			fclose(f);
		}
#endif
	}